

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O0

void __thiscall
TPZInterpolatedElement::RestrainSide
          (TPZInterpolatedElement *this,int side,TPZInterpolatedElement *large,int neighbourside)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  TPZCompEl *pTVar10;
  ostream *poVar11;
  TPZStepSolver<double> *this_00;
  long lVar12;
  TPZConnect *pTVar13;
  TPZGeoEl *pTVar14;
  void *pvVar15;
  double *pdVar16;
  int64_t ipos_00;
  int64_t jpos_00;
  int in_ECX;
  TPZCompEl *in_RDX;
  int in_ESI;
  TPZCompEl *in_RDI;
  double dVar17;
  int64_t jnodindex_1;
  TPZDepend *depend;
  int64_t jnodindex;
  int64_t ndepend;
  int64_t inodindex;
  TPZConnect *inod;
  int64_t jpos;
  int64_t ipos;
  int j;
  int i;
  int jbl;
  int ibl;
  TPZFNMatrix<20,_double> blocknorm;
  uint nshape_1;
  TPZConnect *c_2;
  int locid_1;
  uint nshape;
  TPZConnect *c_1;
  int locid;
  TPZBlock MBlocklarge;
  TPZBlock MBlocksmall;
  int numsidenodes_large;
  int numsidenodes_small;
  TPZStepSolver<double> MSolve;
  int it;
  REAL weight;
  int64_t jn;
  int64_t in;
  TPZManVector<double,_3> pointl;
  TPZManVector<double,_3> par;
  TPZFNMatrix<1000,_double> *M;
  TPZFNMatrix<1000,_double> MSL;
  TPZFNMatrix<100,_double> dphil;
  TPZFNMatrix<100,_double> phil;
  TPZFNMatrix<100,_double> dphis;
  TPZFNMatrix<100,_double> phis;
  int numshapel;
  int largesidedimension;
  int sidedimension;
  int numshape;
  int numint;
  TPZIntPoints *intrule;
  int sideorder;
  int largeorder;
  int sideord;
  TPZConnect *c;
  int sidecon;
  int maxord;
  int nsideconnects;
  TPZTransform<double> t;
  TPZConnect *myconnect;
  int locind;
  TPZInterpolatedElement *cel;
  TPZGeoElSide largegeoside;
  TPZCompElSide largecompside;
  TPZGeoElSide thisgeoside;
  TPZCompElSide thisside;
  int in_stack_ffffffffffffc6a8;
  DecomposeType in_stack_ffffffffffffc6ac;
  int in_stack_ffffffffffffc6b0;
  undefined4 in_stack_ffffffffffffc6b4;
  TPZCompEl *in_stack_ffffffffffffc6b8;
  undefined4 in_stack_ffffffffffffc6c0;
  int in_stack_ffffffffffffc6c4;
  TPZFNMatrix<1000,_double> *in_stack_ffffffffffffc6c8;
  int in_stack_ffffffffffffc6d0;
  int in_stack_ffffffffffffc6d4;
  TPZBlock *in_stack_ffffffffffffc6d8;
  undefined4 in_stack_ffffffffffffc6e0;
  undefined4 in_stack_ffffffffffffc6e4;
  TPZAutoPointer<TPZMatrix<double>_> *in_stack_ffffffffffffc6e8;
  TPZFNMatrix<1000,_double> *in_stack_ffffffffffffc6f0;
  int in_stack_ffffffffffffc790;
  int in_stack_ffffffffffffc794;
  TPZBaseMatrix *in_stack_ffffffffffffc798;
  TPZBlock *in_stack_ffffffffffffc7a0;
  uint local_3720;
  TPZFMatrix<double> *in_stack_ffffffffffffc948;
  undefined4 in_stack_ffffffffffffc950;
  int in_stack_ffffffffffffc954;
  long *local_3688;
  long local_3648;
  TPZFMatrix<double> *in_stack_ffffffffffffc9d0;
  long in_stack_ffffffffffffc9d8;
  int in_stack_ffffffffffffc9e0;
  int in_stack_ffffffffffffc9e4;
  int in_stack_ffffffffffffc9e8;
  int in_stack_ffffffffffffc9ec;
  int in_stack_ffffffffffffca00;
  int in_stack_ffffffffffffca08;
  size_t in_stack_ffffffffffffcac8;
  char *in_stack_ffffffffffffcad0;
  int local_31f4;
  double local_31f0;
  long local_31e8;
  ulong local_31e0;
  undefined1 local_31d8 [56];
  undefined1 local_31a0 [56];
  undefined8 local_3168;
  void *local_3160;
  undefined8 local_3158;
  TPZTransform<double> *in_stack_ffffffffffffd020;
  TPZGeoElSide *in_stack_ffffffffffffd028;
  TPZGeoElSide *in_stack_ffffffffffffd030;
  undefined1 local_1178 [952];
  undefined1 local_dc0 [952];
  undefined1 local_a08 [952];
  undefined1 local_650 [956];
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  long *local_280;
  uint local_274;
  int local_270;
  uint local_26c;
  TPZConnect *local_268;
  int local_25c;
  uint local_258;
  int local_254;
  TPZStepSolver<double> *local_98;
  int local_90;
  undefined4 local_8c;
  long *local_88;
  TPZCompElSide local_58 [2];
  TPZCompElSide local_30;
  int local_1c;
  TPZCompEl *local_18;
  int local_c;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  TPZCompElSide::TPZCompElSide(&local_30,in_RDI,in_ESI);
  TPZCompElSide::Reference((TPZCompElSide *)in_stack_ffffffffffffc6c8);
  TPZCompElSide::TPZCompElSide(local_58,local_18,local_1c);
  TPZCompElSide::Reference((TPZCompElSide *)in_stack_ffffffffffffc6c8);
  local_88 = (long *)0x0;
  iVar5 = TPZCompElSide::Exists(local_58);
  if (iVar5 != 0) {
    pTVar10 = TPZCompElSide::Element(local_58);
    if (pTVar10 == (TPZCompEl *)0x0) {
      local_3688 = (long *)0x0;
    }
    else {
      local_3688 = (long *)__dynamic_cast(pTVar10,&TPZCompEl::typeinfo,&typeinfo,0);
    }
    local_88 = local_3688;
  }
  if (local_88 == (long *)0x0) {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - null computational element.");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    local_8c = 1;
  }
  else {
    local_90 = (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_c);
    if (local_90 < 0) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffcad0,in_stack_ffffffffffffcac8);
    }
    this_00 = (TPZStepSolver<double> *)(**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_90);
    local_98 = this_00;
    uVar6 = TPZConnect::NShape((TPZConnect *)this_00);
    if (uVar6 == 0) {
      local_8c = 1;
    }
    else {
      iVar5 = TPZConnect::HasDependency((TPZConnect *)local_98);
      if ((iVar5 != 0) &&
         (in_stack_ffffffffffffc954 =
               TPZGeoElSide::Dimension
                         ((TPZGeoElSide *)
                          CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0)),
         0 < in_stack_ffffffffffffc954)) {
        in_stack_ffffffffffffc948 =
             (TPZFMatrix<double> *)
             std::operator<<((ostream *)&std::cout,"RestrainSide - unnecessary call to restrainside"
                            );
        std::ostream::operator<<(in_stack_ffffffffffffc948,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_ffffffffffffcad0,in_stack_ffffffffffffcac8);
      }
      plVar3 = local_88;
      iVar7 = TPZCompElSide::Side(local_58);
      uVar8 = (**(code **)(*plVar3 + 0x310))(plVar3,iVar7);
      lVar12 = (**(code **)(*plVar3 + 0xa0))(plVar3,uVar8);
      if (lVar12 == -1) {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "Exiting RestrainSide - Side of large element not initialized");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_ffffffffffffcad0,in_stack_ffffffffffffcac8);
        local_8c = 1;
      }
      else {
        iVar7 = TPZGeoElSide::Dimension
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
        iVar9 = TPZGeoElSide::Dimension
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
        if (iVar7 < iVar9) {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "Exiting RestrainSide - Trying to restrict to a side of smaller dimension"
                                   );
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pzinternal::DebugStopImpl(in_stack_ffffffffffffcad0,in_stack_ffffffffffffcac8);
          local_8c = 1;
        }
        else {
          TPZGeoElSide::Dimension
                    ((TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
          TPZTransform<double>::TPZTransform
                    ((TPZTransform<double> *)in_stack_ffffffffffffc6f0,
                     (int)((ulong)in_stack_ffffffffffffc6e8 >> 0x20));
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                     (TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffc6ac,in_stack_ffffffffffffc6a8));
          TPZGeoElSide::SideTransform3
                    (in_stack_ffffffffffffd030,in_stack_ffffffffffffd028,in_stack_ffffffffffffd020);
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1afec1f);
          local_254 = (**(code **)(*(long *)in_RDI + 0x248))(in_RDI,local_c);
          local_258 = 1;
          for (local_25c = 0; local_25c < local_254; local_25c = local_25c + 1) {
            local_268 = SideConnect((TPZInterpolatedElement *)in_stack_ffffffffffffc6d8,
                                    in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0);
            bVar4 = TPZConnect::Order(local_268);
            local_26c = (uint)bVar4;
            local_3720 = local_26c;
            if ((int)local_26c <= (int)local_258) {
              local_3720 = local_258;
            }
            local_258 = local_3720;
          }
          local_270 = (**(code **)(*(long *)local_18 + 0x338))(local_18,local_1c);
          pTVar13 = (TPZConnect *)(**(code **)(*(long *)in_RDI + 0x318))(in_RDI,local_c);
          bVar4 = TPZConnect::Order(pTVar13);
          local_274 = (uint)bVar4;
          if ((((int)local_274 < local_270) &&
              (iVar7 = TPZGeoElSide::Dimension
                                 ((TPZGeoElSide *)
                                  CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0)),
              iVar7 != 0)) &&
             (iVar7 = TPZGeoElSide::Dimension
                                ((TPZGeoElSide *)
                                 CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0)),
             iVar7 != 0)) {
            pzinternal::DebugStopImpl(in_stack_ffffffffffffcad0,in_stack_ffffffffffffcac8);
          }
          pTVar14 = TPZCompEl::Reference(in_stack_ffffffffffffc6b8);
          local_280 = (long *)(**(code **)(*(long *)pTVar14 + 0x70))(pTVar14,local_c,local_258 * 2);
          if (local_280 == (long *)0x0) {
            poVar11 = std::operator<<((ostream *)&std::cout,
                                      "Exiting RestrainSide - cannot create side integration rule");
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            local_8c = 1;
          }
          else {
            local_284 = (**(code **)(*local_280 + 0x18))();
            local_288 = NSideShapeF((TPZInterpolatedElement *)
                                    CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                                    (int)((ulong)in_stack_ffffffffffffc6c8 >> 0x20));
            local_28c = TPZGeoElSide::Dimension
                                  ((TPZGeoElSide *)
                                   CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
            local_290 = TPZGeoElSide::Dimension
                                  ((TPZGeoElSide *)
                                   CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
            local_294 = NSideShapeF((TPZInterpolatedElement *)
                                    CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                                    (int)((ulong)in_stack_ffffffffffffc6c8 >> 0x20));
            TPZFNMatrix<100,_double>::TPZFNMatrix
                      ((TPZFNMatrix<100,_double> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       (int64_t)in_stack_ffffffffffffc6c8,
                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0));
            TPZFNMatrix<100,_double>::TPZFNMatrix
                      ((TPZFNMatrix<100,_double> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       (int64_t)in_stack_ffffffffffffc6c8,
                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0));
            TPZFNMatrix<100,_double>::TPZFNMatrix
                      ((TPZFNMatrix<100,_double> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       (int64_t)in_stack_ffffffffffffc6c8,
                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0));
            TPZFNMatrix<100,_double>::TPZFNMatrix
                      ((TPZFNMatrix<100,_double> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       (int64_t)in_stack_ffffffffffffc6c8,
                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0));
            local_3158 = 0;
            TPZFNMatrix<1000,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffc6f0,(int64_t)in_stack_ffffffffffffc6e8,
                       CONCAT44(in_stack_ffffffffffffc6e4,in_stack_ffffffffffffc6e0),
                       (double *)in_stack_ffffffffffffc6d8);
            pvVar15 = operator_new(0x1fd8);
            local_3168 = 0;
            TPZFNMatrix<1000,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffc6f0,(int64_t)in_stack_ffffffffffffc6e8,
                       CONCAT44(in_stack_ffffffffffffc6e4,in_stack_ffffffffffffc6e0),
                       (double *)in_stack_ffffffffffffc6d8);
            local_3160 = pvVar15;
            TPZManVector<double,_3>::TPZManVector
                      ((TPZManVector<double,_3> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       (int64_t)in_stack_ffffffffffffc6c8);
            TPZManVector<double,_3>::TPZManVector
                      ((TPZManVector<double,_3> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       (int64_t)in_stack_ffffffffffffc6c8);
            for (local_31f4 = 0; local_31f4 < local_284; local_31f4 = local_31f4 + 1) {
              (**(code **)(*local_280 + 0x20))(local_280,local_31f4,local_31a0,&local_31f0);
              (**(code **)(*(long *)in_RDI + 0x288))(in_RDI,local_c,local_31a0,local_650,local_a08);
              TPZTransform<double>::Apply
                        ((TPZTransform<double> *)
                         CONCAT44(in_stack_ffffffffffffc6e4,in_stack_ffffffffffffc6e0),
                         (TPZVec<double> *)in_stack_ffffffffffffc6d8,
                         (TPZVec<double> *)
                         CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0));
              (**(code **)(*(long *)local_18 + 0x288))
                        (local_18,local_1c,local_31d8,local_dc0,local_1178);
              for (local_31e0 = 0; (long)local_31e0 < (long)local_288; local_31e0 = local_31e0 + 1)
              {
                for (local_31e8 = 0; local_31e8 < local_288; local_31e8 = local_31e8 + 1) {
                  pdVar16 = TPZFMatrix<double>::operator()
                                      ((TPZFMatrix<double> *)
                                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0)
                                       ,(int64_t)in_stack_ffffffffffffc6c8,
                                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0)
                                      );
                  dVar17 = *pdVar16;
                  pdVar16 = TPZFMatrix<double>::operator()
                                      ((TPZFMatrix<double> *)
                                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0)
                                       ,(int64_t)in_stack_ffffffffffffc6c8,
                                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0)
                                      );
                  dVar2 = local_31f0;
                  dVar1 = *pdVar16;
                  pdVar16 = TPZFMatrix<double>::operator()
                                      ((TPZFMatrix<double> *)
                                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0)
                                       ,(int64_t)in_stack_ffffffffffffc6c8,
                                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0)
                                      );
                  *pdVar16 = dVar17 * dVar1 * dVar2 + *pdVar16;
                }
                for (local_31e8 = 0; local_31e8 < local_294; local_31e8 = local_31e8 + 1) {
                  pdVar16 = TPZFMatrix<double>::operator()
                                      ((TPZFMatrix<double> *)
                                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0)
                                       ,(int64_t)in_stack_ffffffffffffc6c8,
                                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0)
                                      );
                  dVar17 = *pdVar16;
                  pdVar16 = TPZFMatrix<double>::operator()
                                      ((TPZFMatrix<double> *)
                                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0)
                                       ,(int64_t)in_stack_ffffffffffffc6c8,
                                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0)
                                      );
                  dVar2 = local_31f0;
                  dVar1 = *pdVar16;
                  pdVar16 = TPZFMatrix<double>::operator()
                                      ((TPZFMatrix<double> *)
                                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0)
                                       ,(int64_t)in_stack_ffffffffffffc6c8,
                                       CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0)
                                      );
                  *pdVar16 = dVar17 * dVar1 * dVar2 + *pdVar16;
                }
              }
            }
            TPZAutoPointer<TPZMatrix<double>>::TPZAutoPointer<TPZFNMatrix<1000,double>>
                      ((TPZAutoPointer<TPZMatrix<double>_> *)
                       CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                       in_stack_ffffffffffffc6c8);
            TPZStepSolver<double>::TPZStepSolver
                      ((TPZStepSolver<double> *)in_stack_ffffffffffffc6f0,in_stack_ffffffffffffc6e8)
            ;
            TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZMatrix<double>_> *)
                       CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
            TPZStepSolver<double>::SetDirect
                      ((TPZStepSolver<double> *)
                       CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                       in_stack_ffffffffffffc6ac);
            TPZStepSolver<double>::Solve
                      (this_00,(TPZFMatrix<double> *)CONCAT44(uVar6,iVar5),
                       (TPZFMatrix<double> *)
                       CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
                       in_stack_ffffffffffffc948);
            iVar5 = (**(code **)(*(long *)in_RDI + 0x248))(in_RDI,local_c);
            iVar7 = (**(code **)(*(long *)local_18 + 0x248))(local_18,local_1c);
            TPZBlock::TPZBlock(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798,
                               in_stack_ffffffffffffc794,in_stack_ffffffffffffc790);
            TPZBlock::TPZBlock(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798,
                               in_stack_ffffffffffffc794,in_stack_ffffffffffffc790);
            for (local_31e0 = 0; (long)local_31e0 < (long)iVar5; local_31e0 = local_31e0 + 1) {
              uVar8 = (**(code **)(*(long *)in_RDI + 0x250))(in_RDI,local_31e0 & 0xffffffff,local_c)
              ;
              pTVar13 = (TPZConnect *)(**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,uVar8);
              TPZConnect::NShape(pTVar13);
              TPZBlock::Set(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d4,
                            in_stack_ffffffffffffc6d0,
                            (int)((ulong)in_stack_ffffffffffffc6c8 >> 0x20));
            }
            for (local_31e0 = 0; (long)local_31e0 < (long)iVar7; local_31e0 = local_31e0 + 1) {
              uVar8 = (**(code **)(*(long *)local_18 + 0x250))
                                (local_18,local_31e0 & 0xffffffff,local_1c);
              pTVar13 = (TPZConnect *)(**(code **)(*(long *)local_18 + 0xa8))(local_18,uVar8);
              TPZConnect::NShape(pTVar13);
              TPZBlock::Set(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d4,
                            in_stack_ffffffffffffc6d0,
                            (int)((ulong)in_stack_ffffffffffffc6c8 >> 0x20));
            }
            TPZBlock::Resequence((TPZBlock *)in_stack_ffffffffffffc6c8,in_stack_ffffffffffffc6c4);
            TPZBlock::Resequence((TPZBlock *)in_stack_ffffffffffffc6c8,in_stack_ffffffffffffc6c4);
            TPZFNMatrix<20,_double>::TPZFNMatrix
                      ((TPZFNMatrix<20,_double> *)in_stack_ffffffffffffc6f0,
                       (int64_t)in_stack_ffffffffffffc6e8,
                       CONCAT44(in_stack_ffffffffffffc6e4,in_stack_ffffffffffffc6e0),
                       (double *)in_stack_ffffffffffffc6d8);
            for (local_31e0 = 0; (long)local_31e0 < (long)iVar5; local_31e0 = local_31e0 + 1) {
              in_stack_ffffffffffffc9ec =
                   TPZBlock::Size((TPZBlock *)
                                  CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                  in_stack_ffffffffffffc6ac);
              if (in_stack_ffffffffffffc9ec != 0) {
                for (local_31e8 = 0; local_31e8 < iVar7; local_31e8 = local_31e8 + 1) {
                  in_stack_ffffffffffffc9e8 =
                       TPZBlock::Size((TPZBlock *)
                                      CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                      in_stack_ffffffffffffc6ac);
                  if (in_stack_ffffffffffffc9e8 != 0) {
                    iVar9 = TPZBlock::Position((TPZBlock *)
                                               CONCAT44(in_stack_ffffffffffffc6b4,
                                                        in_stack_ffffffffffffc6b0),
                                               in_stack_ffffffffffffc6ac);
                    in_stack_ffffffffffffc9d8 = (long)iVar9;
                    iVar9 = TPZBlock::Position((TPZBlock *)
                                               CONCAT44(in_stack_ffffffffffffc6b4,
                                                        in_stack_ffffffffffffc6b0),
                                               in_stack_ffffffffffffc6ac);
                    in_stack_ffffffffffffc9d0 = (TPZFMatrix<double> *)(long)iVar9;
                    for (in_stack_ffffffffffffc9e4 = 0;
                        in_stack_ffffffffffffc9e4 < in_stack_ffffffffffffc9ec;
                        in_stack_ffffffffffffc9e4 = in_stack_ffffffffffffc9e4 + 1) {
                      for (in_stack_ffffffffffffc9e0 = 0;
                          in_stack_ffffffffffffc9e0 < in_stack_ffffffffffffc9e8;
                          in_stack_ffffffffffffc9e0 = in_stack_ffffffffffffc9e0 + 1) {
                        pdVar16 = TPZFMatrix<double>::operator()
                                            ((TPZFMatrix<double> *)
                                             CONCAT44(in_stack_ffffffffffffc6d4,
                                                      in_stack_ffffffffffffc6d0),
                                             (int64_t)in_stack_ffffffffffffc6c8,
                                             CONCAT44(in_stack_ffffffffffffc6c4,
                                                      in_stack_ffffffffffffc6c0));
                        dVar17 = *pdVar16;
                        pdVar16 = TPZFMatrix<double>::operator()
                                            ((TPZFMatrix<double> *)
                                             CONCAT44(in_stack_ffffffffffffc6d4,
                                                      in_stack_ffffffffffffc6d0),
                                             (int64_t)in_stack_ffffffffffffc6c8,
                                             CONCAT44(in_stack_ffffffffffffc6c4,
                                                      in_stack_ffffffffffffc6c0));
                        dVar1 = *pdVar16;
                        pdVar16 = TPZFMatrix<double>::operator()
                                            ((TPZFMatrix<double> *)
                                             CONCAT44(in_stack_ffffffffffffc6d4,
                                                      in_stack_ffffffffffffc6d0),
                                             (int64_t)in_stack_ffffffffffffc6c8,
                                             CONCAT44(in_stack_ffffffffffffc6c4,
                                                      in_stack_ffffffffffffc6c0));
                        *pdVar16 = ABS(dVar17) * ABS(dVar1) + *pdVar16;
                      }
                    }
                    iVar9 = in_stack_ffffffffffffc9ec * in_stack_ffffffffffffc9e8;
                    pdVar16 = TPZFMatrix<double>::operator()
                                        ((TPZFMatrix<double> *)
                                         CONCAT44(in_stack_ffffffffffffc6d4,
                                                  in_stack_ffffffffffffc6d0),
                                         (int64_t)in_stack_ffffffffffffc6c8,
                                         CONCAT44(in_stack_ffffffffffffc6c4,
                                                  in_stack_ffffffffffffc6c0));
                    *pdVar16 = *pdVar16 / (double)iVar9;
                    pdVar16 = TPZFMatrix<double>::operator()
                                        ((TPZFMatrix<double> *)
                                         CONCAT44(in_stack_ffffffffffffc6d4,
                                                  in_stack_ffffffffffffc6d0),
                                         (int64_t)in_stack_ffffffffffffc6c8,
                                         CONCAT44(in_stack_ffffffffffffc6c4,
                                                  in_stack_ffffffffffffc6c0));
                    dVar17 = sqrt(*pdVar16);
                    pdVar16 = TPZFMatrix<double>::operator()
                                        ((TPZFMatrix<double> *)
                                         CONCAT44(in_stack_ffffffffffffc6d4,
                                                  in_stack_ffffffffffffc6d0),
                                         (int64_t)in_stack_ffffffffffffc6c8,
                                         CONCAT44(in_stack_ffffffffffffc6c4,
                                                  in_stack_ffffffffffffc6c0));
                    *pdVar16 = dVar17;
                  }
                }
              }
            }
            uVar8 = (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_c);
            ipos_00 = (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,uVar8);
            uVar8 = (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_c);
            jpos_00 = (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,uVar8);
            local_3648 = 0;
            local_31e0 = (ulong)(iVar5 + -1);
            for (local_31e8 = 0; local_31e8 < iVar7; local_31e8 = local_31e8 + 1) {
              iVar5 = TPZBlock::Size((TPZBlock *)
                                     CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                     in_stack_ffffffffffffc6ac);
              if ((iVar5 != 0) &&
                 (iVar5 = TPZBlock::Size((TPZBlock *)
                                         CONCAT44(in_stack_ffffffffffffc6b4,
                                                  in_stack_ffffffffffffc6b0),
                                         in_stack_ffffffffffffc6ac), iVar5 != 0)) {
                SideConnectIndex((TPZInterpolatedElement *)
                                 CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                 in_stack_ffffffffffffc6ac,in_stack_ffffffffffffc6a8);
                TPZBlock::Position((TPZBlock *)
                                   CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                   in_stack_ffffffffffffc6ac);
                TPZBlock::Position((TPZBlock *)
                                   CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                   in_stack_ffffffffffffc6ac);
                in_stack_ffffffffffffc6a8 =
                     TPZBlock::Size((TPZBlock *)
                                    CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                    in_stack_ffffffffffffc6ac);
                in_stack_ffffffffffffc6b0 =
                     TPZBlock::Size((TPZBlock *)
                                    CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                    in_stack_ffffffffffffc6ac);
                TPZConnect::AddDependency
                          ((TPZConnect *)
                           CONCAT44(in_stack_ffffffffffffc9ec,in_stack_ffffffffffffc9e8),
                           CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                           in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,ipos_00,jpos_00,
                           in_stack_ffffffffffffca00,in_stack_ffffffffffffca08);
                pdVar16 = TPZFMatrix<double>::operator()
                                    ((TPZFMatrix<double> *)
                                     CONCAT44(in_stack_ffffffffffffc6d4,in_stack_ffffffffffffc6d0),
                                     (int64_t)in_stack_ffffffffffffc6c8,
                                     CONCAT44(in_stack_ffffffffffffc6c4,in_stack_ffffffffffffc6c0));
                if (*pdVar16 <= 1e-08 && *pdVar16 != 1e-08) {
                  TPZFMatrix<double>::Zero
                            ((TPZFMatrix<double> *)
                             CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
                }
                local_3648 = local_3648 + 1;
              }
            }
            if (local_3648 == 0) {
              for (local_31e8 = 0; local_31e8 < iVar7; local_31e8 = local_31e8 + 1) {
                SideConnectIndex((TPZInterpolatedElement *)
                                 CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                 in_stack_ffffffffffffc6ac,in_stack_ffffffffffffc6a8);
                iVar5 = TPZBlock::Size((TPZBlock *)
                                       CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0)
                                       ,in_stack_ffffffffffffc6ac);
                if (iVar5 != 0) {
                  TPZBlock::Position((TPZBlock *)
                                     CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                     in_stack_ffffffffffffc6ac);
                  TPZBlock::Position((TPZBlock *)
                                     CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                     in_stack_ffffffffffffc6ac);
                  in_stack_ffffffffffffc6a8 =
                       TPZBlock::Size((TPZBlock *)
                                      CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                      in_stack_ffffffffffffc6ac);
                  in_stack_ffffffffffffc6b0 =
                       TPZBlock::Size((TPZBlock *)
                                      CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0),
                                      in_stack_ffffffffffffc6ac);
                  TPZConnect::AddDependency
                            ((TPZConnect *)
                             CONCAT44(in_stack_ffffffffffffc9ec,in_stack_ffffffffffffc9e8),
                             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                             in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,ipos_00,jpos_00,
                             in_stack_ffffffffffffca00,in_stack_ffffffffffffca08);
                }
              }
            }
            if (local_280 != (long *)0x0) {
              (**(code **)(*local_280 + 8))();
            }
            TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1b00181);
            TPZBlock::~TPZBlock((TPZBlock *)0x1b0018e);
            TPZBlock::~TPZBlock((TPZBlock *)0x1b0019b);
            TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)0x1b001a8);
            TPZManVector<double,_3>::~TPZManVector
                      ((TPZManVector<double,_3> *)
                       CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
            TPZManVector<double,_3>::~TPZManVector
                      ((TPZManVector<double,_3> *)
                       CONCAT44(in_stack_ffffffffffffc6b4,in_stack_ffffffffffffc6b0));
            TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x1b001cf);
            TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1b001dc);
            TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1b001e9);
            TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1b001f6);
            TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1b00203);
            local_8c = 0;
          }
          TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b0021b);
        }
      }
    }
  }
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b00228);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b00235);
  return;
}

Assistant:

void TPZInterpolatedElement::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    TPZCompElSide thisside(this, side);
    TPZGeoElSide thisgeoside = thisside.Reference();
    TPZCompElSide largecompside(large, neighbourside);
    TPZGeoElSide largegeoside = largecompside.Reference();
    TPZInterpolatedElement *cel = nullptr;
    if (largecompside.Exists()) cel = dynamic_cast<TPZInterpolatedElement *> (largecompside.Element());
    if (!cel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    int locind = MidSideConnectLocId(side);
    if (locind < 0) {
        DebugStop();
    }
    TPZConnect &myconnect = Connect(locind);
    if (myconnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myconnect.HasDependency() && largegeoside.Dimension() > 0) {
        LOGPZ_WARN(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (cel->ConnectIndex(cel->MidSideConnectLocId(largecompside.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largegeoside.Dimension() < thisgeoside.Dimension()) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Trying to restrict to a side of smaller dimension");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisgeoside.Dimension());
    thisgeoside.SideTransform3(largegeoside, t);
    int nsideconnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nsideconnects; sidecon++) {
        TPZConnect &c = SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    int largeorder = large->EffectiveSideOrder(neighbourside);
    int sideorder = MidSideConnect(side).Order();
    if (sideorder < largeorder && thisgeoside.Dimension() && largegeoside.Dimension()) {
        DebugStop();
    }
    TPZIntPoints *intrule = Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    int numint = intrule->NPoints();
    int numshape = NSideShapeF(side);
    int sidedimension = thisgeoside.Dimension();
    int largesidedimension = largegeoside.Dimension();
    int numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<100, REAL> phis(numshape, 1), dphis(2, numshape), phil(numshapel, 1), dphil(2, numshapel);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(sidedimension), pointl(largesidedimension); //,point(3);
    int64_t in, jn;
    REAL weight;
    for (int it = 0; it < numint; it++) {
        intrule->Point(it, par, weight);
        SideShapeFunction(side, par, phis, dphis);
        t.Apply(par, pointl);
        large->SideShapeFunction(neighbourside, pointl, phil, dphil);
        for (in = 0; in < numshape; in++) {
            for (jn = 0; jn < numshape; jn++) {
                (*M)(in, jn) += phis(in, 0) * phis(jn, 0) * weight;
            }
            for (jn = 0; jn < numshapel; jn++) {
                MSL(in, jn) += phis(in, 0) * phil(jn, 0) * weight;
            }
        }
    }
#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    //MSolve.ResetMatrix();
    int numsidenodes_small = NSideConnects(side);
    // Philippe 12/3/99
    //  int numsidenodes_large = NSideConnects(neighbourside);
    int numsidenodes_large = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, numsidenodes_small), MBlocklarge(0, numsidenodes_large);
    for (in = 0; in < numsidenodes_small; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (in = 0; in < numsidenodes_large; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(numsidenodes_small, numsidenodes_large, 0.);
    for (in = 0; in < numsidenodes_small; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = Connect(MidSideConnectLocId(side));
    int64_t inodindex = ConnectIndex(MidSideConnectLocId(side));
    int64_t ndepend = 0;
    in = numsidenodes_small - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (jn = 0; jn < numsidenodes_large; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        //cout << "Caso esquisito!!! Chame o Boss que vc receberem premio\n";
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                        MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // a matriz frestraint deveria ser igual a MSL
    TPZCheckRestraint test(thisside, largecompside);
    //test.Print(cout);
    int64_t imsl, jmsl;
    int64_t rmsl = MSL.Rows();
    int64_t cmsl = MSL.Cols();
    int64_t rtest = test.RestraintMatrix().Rows();
    int64_t ctest = test.RestraintMatrix().Cols();

    if (rtest != rmsl || ctest != cmsl) {
        stringstream sout;
        sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n"
                << "press any key to continue";
        LOGPZ_ERROR(logger, sout.str());
        int a;
        cin >> a;
        return;
    }

    TPZFMatrix<REAL> mslc(MSL);
    mslc -= test.RestraintMatrix();

    REAL normmsl = 0.;
    for (imsl = 0; imsl < rmsl; imsl++) {
        for (jmsl = 0; jmsl < cmsl; jmsl++) {
            normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
        }
    }
    if (normmsl > 1.E-6) {
        stringstream sout;
        sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
        mslc.Print("Difference Matrix ", sout);
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                    sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                            << test.RestraintMatrix()(imsl, jmsl) << endl;
                }
            }
        }
        LOGPZ_ERROR(logger, sout.str());
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
    }

    // verificar a norma de MSL
    if (test.CheckRestraint()) {
        stringstream sout
        sout << "TPZInterpolatedElement::Error::Bad restraints detected\n"; // recado de erro.
        test.Print(sout);
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
        test.Diagnose();
        LOGPZ_ERROR(logger, sout.str());
        TPZCheckRestraint test2(thisside, largecompside);
    }
#endif
}